

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O2

void __thiscall
VarBind::VarBind(VarBind *this,shared_ptr<OIDType> *oid,shared_ptr<BER_CONTAINER> *value)

{
  std::__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2> *)this,
             &oid->super___shared_ptr<OIDType,_(__gnu_cxx::_Lock_policy)2>);
  this->type = ((value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _type;
  std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>,
             &value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>);
  this->errorStatus = NO_ERROR;
  return;
}

Assistant:

VarBind(const std::shared_ptr<OIDType>& oid, SNMP_ERROR_STATUS error): oid(oid), type(NULLTYPE), value(new NullType()), errorStatus(error){}